

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArray.H
# Opt level: O3

void __thiscall
amrex::FabArray<amrex::IArrayBox>::FabArray
          (FabArray<amrex::IArrayBox> *this,FabArray<amrex::IArrayBox> *rhs,MakeType maketype,
          int scomp,int ncomp)

{
  pointer *pppIVar1;
  FabFactory<amrex::IArrayBox> *pFVar2;
  iterator __position;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer *__ptr;
  ulong uVar5;
  uint uVar6;
  IArrayBox *local_68;
  undefined8 uStack_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  undefined8 local_40;
  int local_38;
  
  FabArrayBase::FabArrayBase(&this->super_FabArrayBase);
  (this->super_FabArrayBase)._vptr_FabArrayBase = (_func_int **)&PTR__FabArray_0080d078;
  iVar3 = (*((rhs->m_factory)._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::IArrayBox>,_std::default_delete<amrex::FabFactory<amrex::IArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::IArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::IArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::IArrayBox>_*,_false>._M_head_impl)->
            _vptr_FabFactory[5])();
  (this->m_factory)._M_t.
  super___uniq_ptr_impl<amrex::FabFactory<amrex::IArrayBox>,_std::default_delete<amrex::FabFactory<amrex::IArrayBox>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_amrex::FabFactory<amrex::IArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::IArrayBox>_>_>
  .super__Head_base<0UL,_amrex::FabFactory<amrex::IArrayBox>_*,_false>._M_head_impl =
       (FabFactory<amrex::IArrayBox> *)CONCAT44(extraout_var,iVar3);
  (this->m_dallocator).m_arena = (Arena *)0x0;
  this->define_function_called = false;
  (this->m_fabs_v).super__Vector_base<amrex::IArrayBox_*,_std::allocator<amrex::IArrayBox_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_fabs_v).super__Vector_base<amrex::IArrayBox_*,_std::allocator<amrex::IArrayBox_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_fabs_v).super__Vector_base<amrex::IArrayBox_*,_std::allocator<amrex::IArrayBox_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_hp_arrays = (void *)0x0;
  (this->m_arrays).hp = (Array4<int> *)0x0;
  (this->m_const_arrays).hp = (Array4<const_int> *)0x0;
  (this->m_tags).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_tags).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->m_tags).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->m_tags).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->shmem).n_values = 0;
  (this->shmem).n_points = 0;
  (this->fbd)._M_t.
  super___uniq_ptr_impl<amrex::FBData<amrex::IArrayBox>,_std::default_delete<amrex::FBData<amrex::IArrayBox>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_amrex::FBData<amrex::IArrayBox>_*,_std::default_delete<amrex::FBData<amrex::IArrayBox>_>_>
  .super__Head_base<0UL,_amrex::FBData<amrex::IArrayBox>_*,_false>._M_head_impl =
       (FBData<amrex::IArrayBox> *)0x0;
  (this->pcd)._M_t.
  super___uniq_ptr_impl<amrex::PCData<amrex::IArrayBox>,_std::default_delete<amrex::PCData<amrex::IArrayBox>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_amrex::PCData<amrex::IArrayBox>_*,_std::default_delete<amrex::PCData<amrex::IArrayBox>_>_>
  .super__Head_base<0UL,_amrex::PCData<amrex::IArrayBox>_*,_false>._M_head_impl =
       (PCData<amrex::IArrayBox> *)0x0;
  (this->os_temp)._M_t.
  super___uniq_ptr_impl<amrex::FabArray<amrex::IArrayBox>,_std::default_delete<amrex::FabArray<amrex::IArrayBox>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_amrex::FabArray<amrex::IArrayBox>_*,_std::default_delete<amrex::FabArray<amrex::IArrayBox>_>_>
  .super__Head_base<0UL,_amrex::FabArray<amrex::IArrayBox>_*,_false>._M_head_impl =
       (FabArray<amrex::IArrayBox> *)0x0;
  DAT_00817380 = DAT_00817380 + 1;
  iVar4 = FabArrayBase::m_FA_stats + 1;
  if (FabArrayBase::m_FA_stats < DAT_00817374) {
    iVar4 = DAT_00817374;
  }
  local_40 = *(undefined8 *)(rhs->super_FabArrayBase).n_grow.vect;
  local_38 = (rhs->super_FabArrayBase).n_grow.vect[2];
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68 = (IArrayBox *)0x0;
  uStack_60 = 0;
  FabArrayBase::m_FA_stats = FabArrayBase::m_FA_stats + 1;
  DAT_00817374 = iVar4;
  (*(this->super_FabArrayBase)._vptr_FabArrayBase[3])
            (this,&(rhs->super_FabArrayBase).boxarray,&(rhs->super_FabArrayBase).distributionMap,
             ncomp,&local_40,&local_68,(FabFactory<amrex::IArrayBox> *)CONCAT44(extraout_var,iVar3))
  ;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  if (maketype == make_alias) {
    uVar6 = (uint)((ulong)((long)(this->super_FabArrayBase).indexArray.
                                 super_vector<int,_std::allocator<int>_>.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)(this->super_FabArrayBase).indexArray.
                                super_vector<int,_std::allocator<int>_>.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 2);
    if (0 < (int)uVar6) {
      uVar5 = 0;
      do {
        pFVar2 = (this->m_factory)._M_t.
                 super___uniq_ptr_impl<amrex::FabFactory<amrex::IArrayBox>,_std::default_delete<amrex::FabFactory<amrex::IArrayBox>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_amrex::FabFactory<amrex::IArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::IArrayBox>_>_>
                 .super__Head_base<0UL,_amrex::FabFactory<amrex::IArrayBox>_*,_false>._M_head_impl;
        iVar4 = (*pFVar2->_vptr_FabFactory[3])
                          (pFVar2,(rhs->m_fabs_v).
                                  super__Vector_base<amrex::IArrayBox_*,_std::allocator<amrex::IArrayBox_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar5],
                           (ulong)(uint)scomp,ncomp);
        local_68 = (IArrayBox *)CONCAT44(extraout_var_00,iVar4);
        __position._M_current =
             (this->m_fabs_v).
             super__Vector_base<amrex::IArrayBox_*,_std::allocator<amrex::IArrayBox_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->m_fabs_v).
            super__Vector_base<amrex::IArrayBox_*,_std::allocator<amrex::IArrayBox_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<amrex::IArrayBox*,std::allocator<amrex::IArrayBox*>>::
          _M_realloc_insert<amrex::IArrayBox*>
                    ((vector<amrex::IArrayBox*,std::allocator<amrex::IArrayBox*>> *)&this->m_fabs_v,
                     __position,&local_68);
        }
        else {
          *__position._M_current = local_68;
          pppIVar1 = &(this->m_fabs_v).
                      super__Vector_base<amrex::IArrayBox_*,_std::allocator<amrex::IArrayBox_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          *pppIVar1 = *pppIVar1 + 1;
        }
        uVar5 = uVar5 + 1;
      } while ((uVar6 & 0x7fffffff) != uVar5);
    }
  }
  else {
    Abort_host("FabArray: unknown MakeType");
  }
  return;
}

Assistant:

FabArray<FAB>::FabArray (const FabArray<FAB>& rhs, MakeType maketype, int scomp, int ncomp)
    : m_factory(rhs.Factory().clone()),
      shmem()
{
    m_FA_stats.recordBuild();
    define(rhs.boxArray(), rhs.DistributionMap(), ncomp, rhs.nGrowVect(),
           MFInfo().SetAlloc(false), *m_factory);

    if (maketype == amrex::make_alias)
    {
        for (int i = 0, n = indexArray.size(); i < n; ++i) {
            auto const& rhsfab = *(rhs.m_fabs_v[i]);
            m_fabs_v.push_back(m_factory->create_alias(rhsfab, scomp, ncomp));
        }
    }
    else
    {
        amrex::Abort("FabArray: unknown MakeType");
    }
}